

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataFunctionNames.cpp
# Opt level: O2

void findMetadataFunctionNames(Module *module,Program *program)

{
  DIVariable *pDVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Module *pMVar5;
  Func *this;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *globalVarNames;
  Function *pFVar6;
  Use *pUVar7;
  long lVar8;
  DIVariable *this_00;
  CallBase *this_01;
  Module *f;
  Function *pFVar9;
  Function *pFVar10;
  undefined1 auVar11 [16];
  StringRef local_a8;
  Module *local_98;
  Module *local_90;
  Function *local_88;
  Func *local_80;
  Function *local_78;
  undefined1 local_70 [2] [16];
  regex varName;
  
  local_98 = module + 0x18;
  pMVar5 = module + 0x20;
  while (pMVar5 = *(Module **)pMVar5, pMVar5 != local_98) {
    f = pMVar5 + -0x38;
    if (pMVar5 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    local_90 = pMVar5;
    cVar2 = llvm::GlobalValue::isDeclaration();
    if (cVar2 == '\0') {
      this = Program::getFunction(program,(Function *)f);
      globalVarNames = Program::getGlobalVarNames_abi_cxx11_(program);
      local_80 = this;
      Func::
      fillMetadataVarNames<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (this,globalVarNames);
      local_88 = (Function *)f + 0x48;
      pFVar6 = (Function *)f + 0x50;
      while (pFVar6 = *(Function **)pFVar6, pFVar6 != local_88) {
        pFVar10 = pFVar6 + -0x18;
        if (pFVar6 == (Function *)0x0) {
          pFVar10 = (Function *)0x0;
        }
        local_78 = pFVar6;
        for (pFVar9 = pFVar10 + 0x30; pFVar9 = *(Function **)pFVar9, pFVar9 != pFVar10 + 0x28;
            pFVar9 = pFVar9 + 8) {
          this_01 = (CallBase *)(pFVar9 + -0x18);
          if (pFVar9 == (Function *)0x0) {
            this_01 = (CallBase *)0x0;
          }
          if (this_01[0x10] == (CallBase)0x53) {
            pFVar6 = llvm::CallBase::getCalledFunction(this_01);
            if (pFVar6 != (Function *)0x0) {
              llvm::CallBase::getCalledFunction(this_01);
              auVar11 = llvm::Value::getName();
              local_70[0] = auVar11;
              llvm::StringRef::str_abi_cxx11_((string *)&varName,(StringRef *)local_70);
              iVar4 = std::__cxx11::string::compare((char *)&varName);
              std::__cxx11::string::~string((string *)&varName);
              if (iVar4 == 0) {
                pUVar7 = llvm::User::getOperandList((User *)this_01);
                lVar8 = *(long *)(pUVar7 + 0x20);
                if (*(char *)(lVar8 + 0x10) != '\x16') {
                  lVar8 = 0;
                }
                pDVar1 = *(DIVariable **)(lVar8 + 0x18);
                this_00 = (DIVariable *)0x0;
                if ((pDVar1 != (DIVariable *)0x0) && (this_00 = pDVar1, *pDVar1 != (DIVariable)0x19)
                   ) {
                  this_00 = (DIVariable *)0x0;
                }
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&varName,
                           "var[0-9]+",0x10);
                local_a8 = llvm::DIVariable::getName(this_00);
                llvm::StringRef::str_abi_cxx11_((string *)local_70,&local_a8);
                bVar3 = std::
                        regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                  ((string *)local_70,
                                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&varName,
                                   0);
                std::__cxx11::string::~string((string *)local_70);
                if (bVar3) {
                  local_a8 = llvm::DIVariable::getName(this_00);
                  llvm::StringRef::str_abi_cxx11_((string *)local_70,&local_a8);
                  Func::addMetadataVarName(local_80,(string *)local_70);
                  std::__cxx11::string::~string((string *)local_70);
                }
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&varName);
              }
            }
          }
        }
        pFVar6 = local_78 + 8;
      }
    }
    pMVar5 = local_90 + 8;
  }
  Program::addPass(program,FindMetadataFunctionNames);
  return;
}

Assistant:

void findMetadataFunctionNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctions));

    for (const llvm::Function& func : module->functions()) {
        if (func.isDeclaration())
            continue;

        auto function = program.getFunction(&func);
        assert(function && "Do not have function");

        function->fillMetadataVarNames(program.getGlobalVarNames());

        for (const llvm::BasicBlock& block : func) {
            for (const llvm::Instruction& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const auto CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction() && CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                        llvm::Metadata* varMD = llvm::dyn_cast_or_null<llvm::MetadataAsValue>(ins.getOperand(1))->getMetadata();
                        llvm::DILocalVariable* localVar = llvm::dyn_cast_or_null<llvm::DILocalVariable>(varMD);

                        std::regex varName("var[0-9]+");
                        if (std::regex_match(localVar->getName().str(), varName)) {
                            function->addMetadataVarName(localVar->getName().str());
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::FindMetadataFunctionNames);
}